

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMdisk.cpp
# Opt level: O0

bool ParseCommandLine(int argc_,char **argv_)

{
  char *pcVar1;
  __type _Var2;
  int iVar3;
  ulong uVar4;
  exception *peVar5;
  int local_970;
  _Ios_Openmode local_898;
  int local_6bc;
  int i;
  char *pszCommand;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  int local_638;
  allocator<char> local_631;
  string local_630;
  int local_610;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  byte local_56b;
  byte local_56a;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  allocator<char> local_481;
  string local_480 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  allocator<char> local_439;
  string local_438 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  allocator<char> local_3f1;
  string local_3f0;
  undefined1 local_3d0 [8];
  string str_1;
  string local_3a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  allocator<char> local_361;
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  allocator<char> local_319;
  string local_318;
  undefined1 local_2f8 [8];
  string str;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  int local_58;
  int heads;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  char **ppcStack_18;
  int arg;
  char **argv__local;
  int argc__local;
  
  opterr = 1;
  ppcStack_18 = argv_;
  argv__local._0_4_ = argc_;
  while (local_1c = getopt_long((int)argv__local,ppcStack_18,short_options,long_options,(int *)0x0),
        pcVar1 = optarg, local_1c != -1) {
    switch(local_1c) {
    case 0:
      break;
    case 0x30:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,pcVar1,&local_259);
      opt.head0 = util::str_value<int>(&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      if (1 < opt.head0) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[22],char*&,char_const(&)[19]>
                  (peVar5,(char (*) [22])"invalid head0 value \'",&optarg,
                   (char (*) [19])"\', expected 0 or 1");
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x31:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,pcVar1,&local_281);
      opt.head1 = util::str_value<int>(&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      if (1 < opt.head1) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[22],char*&,char_const(&)[19]>
                  (peVar5,(char (*) [22])"invalid head1 value \'",&optarg,
                   (char (*) [19])"\', expected 0 or 1");
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x3a:
    case 0x3f:
      pszCommand._6_1_ = 10;
      util::operator<<((LogHelper *)&util::cout,(char *)((long)&pszCommand + 6));
      return false;
    case 0x44:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,pcVar1,&local_209);
      opt.datacopy = util::str_value<int>(&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      break;
    case 0x46:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,pcVar1,&local_231);
      opt.fill = util::str_value<int>(&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator(&local_231);
      if (0xff < opt.fill) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[21],char*&,char_const(&)[18]>
                  (peVar5,(char (*) [21])"invalid fill value \'",&optarg,
                   (char (*) [18])"\', expected 0-255");
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x48:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar1,&local_c9);
      opt.hardsectors = util::str_value<int>(&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      if (opt.hardsectors < 2) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[28],char*&,char_const(&)[2]>
                  (peVar5,(char (*) [28])"invalid hard-sector count \'",&optarg,
                   (char (*) [2])0x2a9ff7);
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x4c:
      std::__cxx11::string::operator=((string *)&opt.label,optarg);
      break;
    case 0x52:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,pcVar1,&local_119);
      opt.rescans = util::str_value<int>(&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      break;
    case 0x62:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,pcVar1,&local_141);
      opt.base = util::str_value<int>(&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      break;
    case 99:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
      util::str_range(&local_40,(int *)&opt,&opt.range.cyl_end);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      iVar3 = Range::cyls(&opt.range);
      if (iVar3 == 0) {
        opt.range.cyl_end = 1;
      }
      break;
    case 100:
      opt.step = 2;
      break;
    case 0x65:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,pcVar1,(allocator<char> *)(str.field_2._M_local_buf + 0xf));
      opt.encoding = encoding_from_string(&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
      if (opt.encoding == Unknown) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[19],char*&,char_const(&)[2]>
                  (peVar5,(char (*) [19])"invalid encoding \'",&optarg,(char (*) [2])0x2a9ff7);
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x66:
      opt.force = opt.force + 1;
      break;
    case 0x67:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,pcVar1,&local_191);
      opt.gap3 = util::str_value<int>(&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      break;
    case 0x68:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,&local_79);
      iVar3 = util::str_value<int>(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      local_58 = iVar3;
      if (2 < iVar3) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[28],char*&,char_const(&)[15],int_const&>
                  (peVar5,(char (*) [28])"invalid head count/select \'",&optarg,
                   (char (*) [15])"\', expected 0-",&MAX_DISK_HEADS);
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      opt.range.head_begin = (int)(iVar3 == 1);
      opt.range.head_end = 2;
      if (iVar3 == 0) {
        opt.range.head_end = 1;
      }
      break;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,pcVar1,&local_1b9);
      opt.interleave = util::str_value<int>(&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      break;
    case 0x6b:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,pcVar1,&local_1e1);
      opt.skew = util::str_value<int>(&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      break;
    case 0x6d:
      opt.minimal = 1;
      break;
    case 0x6e:
      opt.noformat = 1;
      break;
    case 0x72:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar1,&local_f1);
      opt.retries = util::str_value<int>(&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      break;
    case 0x73:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar1,&local_a1);
      opt.sectors = util::str_value<long>(&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      break;
    case 0x74:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,pcVar1,&local_2a9);
      opt.datarate = datarate_from_string(&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      if (opt.datarate == Unknown) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[20],char*&,char_const(&)[2]>
                  (peVar5,(char (*) [20])"invalid data rate \'",&optarg,(char (*) [2])0x2a9ff7);
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x76:
      opt.verbose = opt.verbose + 1;
      break;
    case 0x78:
      opt.hex = 1;
      break;
    case 0x7a:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,pcVar1,&local_169);
      opt.size = util::str_value<int>(&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      break;
    case 0x100:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,pcVar1,&local_591);
      opt.rpm = util::str_value<int>(&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::allocator<char>::~allocator(&local_591);
      if ((opt.rpm != 300) && (opt.rpm != 0x168)) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[14],char*&,char_const(&)[23]>
                  (peVar5,(char (*) [14])"invalid rpm \'",&optarg,
                   (char (*) [23])"\', expected 300 or 360");
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x101:
      if (optarg == (char *)0x0) {
        local_898 = 0x2a9e0d;
      }
      else {
        local_898 = (_Ios_Openmode)optarg;
      }
      std::ofstream::open((char *)&util::log,local_898);
      uVar4 = std::ios::bad();
      if ((uVar4 & 1) != 0) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[36]>
                  (peVar5,(char (*) [36])"failed to open log file for writing");
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      DAT_00306718 = &util::log;
      break;
    case 0x102:
      LongVersion();
      return false;
    case 0x105:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,pcVar1,&local_4f1);
      opt.gapmask = util::str_value<int>(&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator(&local_4f1);
      break;
    case 0x106:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,pcVar1,&local_519);
      opt.maxcopies = util::str_value<int>(&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator(&local_519);
      if (opt.maxcopies == 0) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[26],char*&,char_const(&)[17]>
                  (peVar5,(char (*) [26])"invalid data copy count \'",&optarg,
                   (char (*) [17])"\', expected >= 1");
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x107:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,pcVar1,&local_541);
      opt.maxsplice = util::str_value<int>(&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator(&local_541);
      break;
    case 0x108:
      local_56a = 0;
      local_56b = 0;
      if (optarg == (char *)0x0) {
        local_970 = 1;
      }
      else {
        std::allocator<char>::allocator();
        local_56a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,pcVar1,&local_569);
        local_56b = 1;
        local_970 = util::str_value<int>(&local_568);
      }
      opt.check8k = local_970;
      if ((local_56b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_568);
      }
      if ((local_56a & 1) != 0) {
        std::allocator<char>::~allocator(&local_569);
      }
      break;
    case 0x109:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,pcVar1,&local_681);
      util::str_range(&local_680,&opt.bytes_begin,&opt.bytes_end);
      std::__cxx11::string::~string((string *)&local_680);
      std::allocator<char>::~allocator(&local_681);
      break;
    case 0x10a:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,pcVar1,&local_5b9);
      opt.hdf = util::str_value<int>(&local_5b8);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::allocator<char>::~allocator(&local_5b9);
      if ((opt.hdf != 10) && (opt.hdf != 0xb)) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[22],char*&,char_const(&)[21]>
                  (peVar5,(char (*) [22])"invalid HDF version \'",&optarg,
                   (char (*) [21])"\', expected 10 or 11");
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x10b:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,pcVar1,&local_319);
      util::lowercase((string *)local_2f8,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator(&local_319);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_360,"cylinders",&local_361);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_340,(ulong)local_360);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2f8,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator(&local_361);
      if (_Var2) {
        opt.cylsfirst = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_3a8,"heads",(allocator<char> *)(str_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)&local_388,(ulong)local_3a8);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2f8,&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string(local_3a8);
        std::allocator<char>::~allocator((allocator<char> *)(str_1.field_2._M_local_buf + 0xf));
        if (!_Var2) {
          peVar5 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[21],char*&,char_const(&)[35]>
                    (peVar5,(char (*) [21])"invalid order type \'",&optarg,
                     (char (*) [35])"\', expected \'cylinders\' or \'heads\'");
          __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
        }
        opt.cylsfirst = 0;
      }
      std::__cxx11::string::~string((string *)local_2f8);
      break;
    case 0x10c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,pcVar1,&local_5e1);
      opt.scale = util::str_value<int>(&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator(&local_5e1);
      break;
    case 0x10d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,pcVar1,&local_609);
      opt.plladjust = util::str_value<int>(&local_608);
      std::__cxx11::string::~string((string *)&local_608);
      std::allocator<char>::~allocator(&local_609);
      if ((opt.plladjust < 1) || (0x32 < opt.plladjust)) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        local_610 = 0x32;
        util::exception::exception<char_const(&)[25],char*&,char_const(&)[15],int>
                  (peVar5,(char (*) [25])"invalid pll adjustment \'",&optarg,
                   (char (*) [15])"\', expected 1-",&local_610);
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x10e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,pcVar1,&local_631);
      opt.pllphase = util::str_value<int>(&local_630);
      std::__cxx11::string::~string((string *)&local_630);
      std::allocator<char>::~allocator(&local_631);
      if ((opt.pllphase < 1) || (0x5a < opt.pllphase)) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        local_638 = 0x5a;
        util::exception::exception<char_const(&)[20],char*&,char_const(&)[15],int>
                  (peVar5,(char (*) [20])"invalid pll phase \'",&optarg,
                   (char (*) [15])"\', expected 1-",&local_638);
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x10f:
      opt.encoding = Ace;
      break;
    case 0x110:
      opt.encoding = MX;
      break;
    case 0x111:
      opt.encoding = Agat;
      break;
    case 0x112:
      opt.encoding = MFM;
      break;
    case 0x113:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,pcVar1,&local_659);
      opt.steprate = util::str_value<int>(&local_658);
      std::__cxx11::string::~string((string *)&local_658);
      std::allocator<char>::~allocator(&local_659);
      if (0xf < opt.steprate) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[20],char*&,char_const(&)[17]>
                  (peVar5,(char (*) [20])"invalid step rate \'",&optarg,
                   (char (*) [17])"\', expected 0-15");
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      break;
    case 0x114:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,pcVar1,&local_3f1);
      util::lowercase((string *)local_3d0,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator(&local_3f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_438,"track",&local_439);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_418,(ulong)local_438);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3d0,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string(local_438);
      std::allocator<char>::~allocator(&local_439);
      if (_Var2) {
        opt.prefer = Track;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_480,"bitstream",&local_481);
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)&local_460,(ulong)local_480);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3d0,&local_460);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::string::~string(local_480);
        std::allocator<char>::~allocator(&local_481);
        if (_Var2) {
          opt.prefer = Bitstream;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_4c8,"flux",&local_4c9);
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)&local_4a8,(ulong)local_4c8);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3d0,&local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string(local_4c8);
          std::allocator<char>::~allocator(&local_4c9);
          if (!_Var2) {
            peVar5 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[20],char*&,char_const(&)[33]>
                      (peVar5,(char (*) [20])"invalid data type \'",&optarg,
                       (char (*) [33])"\', expected track/bitstream/flux");
            __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
          }
          opt.prefer = Flux;
        }
      }
      std::__cxx11::string::~string((string *)local_3d0);
      break;
    case 0x115:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a8,pcVar1,(allocator<char> *)((long)&pszCommand + 7));
      opt.debug = util::str_value<int>(&local_6a8);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pszCommand + 7));
      if (opt.debug < 0) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[35]>
                  (peVar5,(char (*) [35])"invalid debug level, expected >= 0");
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
    }
  }
  if (optind < (int)argv__local) {
    pcVar1 = ppcStack_18[optind];
    local_1c = 0xffffffff;
    for (local_6bc = 0; local_6bc < 0xc; local_6bc = local_6bc + 1) {
      iVar3 = strcasecmp(pcVar1,aszCommands[local_6bc]);
      if (iVar3 == 0) {
        if (opt.command != 0) {
          Usage();
        }
        opt.command = local_6bc;
        optind = optind + 1;
        break;
      }
    }
    if (opt.absoffsets != 0) {
      opt.offsets = 1;
    }
    argv__local._7_1_ = true;
  }
  else {
    if (opt.verbose == 0) {
      Usage();
    }
    LongVersion();
    argv__local._7_1_ = false;
  }
  return argv__local._7_1_;
}

Assistant:

bool ParseCommandLine(int argc_, char* argv_[])
{
    int arg;
    opterr = 1;

    while ((arg = getopt_long(argc_, argv_, short_options, long_options, nullptr)) != -1)
    {
        switch (arg)
        {
        case 'c':
            util::str_range(optarg, opt.range.cyl_begin, opt.range.cyl_end);

            // -c0 is shorthand for -c0-0
            if (opt.range.cyls() == 0)
                opt.range.cyl_end = 1;
            break;

        case 'h':
        {
            auto heads = util::str_value<int>(optarg);
            if (heads > MAX_DISK_HEADS)
                throw util::exception("invalid head count/select '", optarg, "', expected 0-", MAX_DISK_HEADS);

            opt.range.head_begin = (heads == 1) ? 1 : 0;
            opt.range.head_end = (heads == 0) ? 1 : 2;
            break;
        }

        case 's':
            opt.sectors = util::str_value<long>(optarg);
            break;

        case 'H':
            opt.hardsectors = util::str_value<int>(optarg);
            if (opt.hardsectors <= 1)
                throw util::exception("invalid hard-sector count '", optarg, "'");
            break;

        case 'r':
            opt.retries = util::str_value<int>(optarg);
            break;

        case 'R':
            opt.rescans = util::str_value<int>(optarg);
            break;

        case 'n':   opt.noformat = 1; break;
        case 'm':   opt.minimal = 1; break;

        case 'b':   opt.base = util::str_value<int>(optarg); break;
        case 'z':   opt.size = util::str_value<int>(optarg); break;
        case 'g':   opt.gap3 = util::str_value<int>(optarg); break;
        case 'i':   opt.interleave = util::str_value<int>(optarg); break;
        case 'k':   opt.skew = util::str_value<int>(optarg); break;
        case 'D':   opt.datacopy = util::str_value<int>(optarg); break;

        case 'F':
            opt.fill = util::str_value<int>(optarg);
            if (opt.fill > 255)
                throw util::exception("invalid fill value '", optarg, "', expected 0-255");
            break;
        case '0':
            opt.head0 = util::str_value<int>(optarg);
            if (opt.head0 > 1)
                throw util::exception("invalid head0 value '", optarg, "', expected 0 or 1");
            break;
        case '1':
            opt.head1 = util::str_value<int>(optarg);
            if (opt.head1 > 1)
                throw util::exception("invalid head1 value '", optarg, "', expected 0 or 1");
            break;

        case 't':
            opt.datarate = datarate_from_string(optarg);
            if (opt.datarate == DataRate::Unknown)
                throw util::exception("invalid data rate '", optarg, "'");
            break;

        case 'e':
            opt.encoding = encoding_from_string(optarg);
            if (opt.encoding == Encoding::Unknown)
                throw util::exception("invalid encoding '", optarg, "'");
            break;

        case 'd':   opt.step = 2; break;
        case 'f':   ++opt.force; break;
        case 'v':   ++opt.verbose; break;
        case 'x':   opt.hex = 1; break;

        case 'L':   opt.label = optarg; break;

        case OPT_LOG:
            util::log.open(optarg ? optarg : "samdisk.log");
            if (util::log.bad())
                throw util::exception("failed to open log file for writing");
            util::cout.file = &util::log;
            break;

        case OPT_ORDER:
        {
            auto str = util::lowercase(optarg);
            if (str == std::string("cylinders").substr(0, str.length()))
                opt.cylsfirst = 1;
            else if (str == std::string("heads").substr(0, str.length()))
                opt.cylsfirst = 0;
            else
                throw util::exception("invalid order type '", optarg, "', expected 'cylinders' or 'heads'");
            break;
        }

        case OPT_PREFER:
        {
            auto str = util::lowercase(optarg);
            if (str == std::string("track").substr(0, str.length()))
                opt.prefer = PreferredData::Track;
            else if (str == std::string("bitstream").substr(0, str.length()))
                opt.prefer = PreferredData::Bitstream;
            else if (str == std::string("flux").substr(0, str.length()))
                opt.prefer = PreferredData::Flux;
            else
                throw util::exception("invalid data type '", optarg, "', expected track/bitstream/flux");
            break;
        }

        case OPT_ACE:   opt.encoding = Encoding::Ace;   break;
        case OPT_MX:    opt.encoding = Encoding::MX;    break;
        case OPT_AGAT:  opt.encoding = Encoding::Agat;  break;
        case OPT_NOFM:  opt.encoding = Encoding::MFM;   break;

        case OPT_GAPMASK:
            opt.gapmask = util::str_value<int>(optarg);
            break;
        case OPT_MAXCOPIES:
            opt.maxcopies = util::str_value<int>(optarg);
            if (!opt.maxcopies)
                throw util::exception("invalid data copy count '", optarg, "', expected >= 1");
            break;
        case OPT_MAXSPLICE:
            opt.maxsplice = util::str_value<int>(optarg);
            break;
        case OPT_CHECK8K:
            opt.check8k = !optarg ? 1 : util::str_value<int>(optarg);
            break;
        case OPT_RPM:
            opt.rpm = util::str_value<int>(optarg);
            if (opt.rpm != 300 && opt.rpm != 360)
                throw util::exception("invalid rpm '", optarg, "', expected 300 or 360");
            break;
        case OPT_HDF:
            opt.hdf = util::str_value<int>(optarg);
            if (opt.hdf != 10 && opt.hdf != 11)
                throw util::exception("invalid HDF version '", optarg, "', expected 10 or 11");
            break;
        case OPT_SCALE:
            opt.scale = util::str_value<int>(optarg);
            break;
        case OPT_PLLADJUST:
            opt.plladjust = util::str_value<int>(optarg);
            if (opt.plladjust <= 0 || opt.plladjust > MAX_PLL_ADJUST)
                throw util::exception("invalid pll adjustment '", optarg, "', expected 1-", MAX_PLL_ADJUST);
            break;
        case OPT_PLLPHASE:
            opt.pllphase = util::str_value<int>(optarg);
            if (opt.pllphase <= 0 || opt.pllphase > MAX_PLL_PHASE)
                throw util::exception("invalid pll phase '", optarg, "', expected 1-", MAX_PLL_PHASE);
            break;
        case OPT_STEPRATE:
            opt.steprate = util::str_value<int>(optarg);
            if (opt.steprate > 15)
                throw util::exception("invalid step rate '", optarg, "', expected 0-15");
            break;

        case OPT_BYTES:
            util::str_range(optarg, opt.bytes_begin, opt.bytes_end);
            break;

        case OPT_DEBUG:
            opt.debug = util::str_value<int>(optarg);
            if (opt.debug < 0)
                throw util::exception("invalid debug level, expected >= 0");
            break;

        case OPT_VERSION:
            LongVersion();
            return false;

        case ':':
        case '?':   // error
            util::cout << '\n';
            return false;

            // long option return
        case 0:
            break;
#ifdef _DEBUG
        default:
            return false;
#endif
        }
    }

    // Fail if there are no non-option arguments
    if (optind >= argc_)
    {
        if (!opt.verbose)
            Usage();

        // Allow -v to show the --version details
        LongVersion();
        return false;
    }

    // The command is the first argument
    char* pszCommand = argv_[optind];

    // Match against known commands
    for (int i = 0; i < cmdEnd; ++i)
    {
        if (!strcasecmp(pszCommand, aszCommands[i]))
        {
            // Fail if a command has already been set
            if (opt.command)
                Usage();

            // Set the command and advance to the next argument position
            opt.command = i;
            ++optind;
            break;
        }
    }

    if (opt.absoffsets) opt.offsets = 1;

    return true;
}